

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float32_le_quiet_tricore(float32 a,float32 b,float_status *status)

{
  flag fVar1;
  flag fVar2;
  float32 a_00;
  float32 a_01;
  int iVar3;
  uint32_t uVar4;
  bool local_2e;
  bool local_2d;
  uint32_t bv;
  uint32_t av;
  flag bSign;
  flag aSign;
  float_status *status_local;
  float32 b_local;
  float32 a_local;
  
  a_00 = float32_squash_input_denormal_tricore(a,status);
  a_01 = float32_squash_input_denormal_tricore(b,status);
  iVar3 = extractFloat32Exp(a_00);
  if (((iVar3 == 0xff) && (uVar4 = extractFloat32Frac(a_00), uVar4 != 0)) ||
     ((iVar3 = extractFloat32Exp(a_01), iVar3 == 0xff &&
      (uVar4 = extractFloat32Frac(a_01), uVar4 != 0)))) {
    iVar3 = float32_is_signaling_nan_tricore(a_00,status);
    if ((iVar3 != 0) || (iVar3 = float32_is_signaling_nan_tricore(a_01,status), iVar3 != 0)) {
      float_raise_tricore('\x01',status);
    }
    b_local = 0;
  }
  else {
    fVar1 = extractFloat32Sign(a_00);
    fVar2 = extractFloat32Sign(a_01);
    if (fVar1 == fVar2) {
      local_2e = a_00 == a_01 || (bool)fVar1 != a_00 < a_01;
      b_local = (float32)local_2e;
    }
    else {
      local_2d = fVar1 != '\0' || ((a_00 | a_01) & 0x7fffffff) == 0;
      b_local = (float32)local_2d;
    }
  }
  return b_local;
}

Assistant:

int float32_le_quiet(float32 a, float32 b, float_status *status)
{
    flag aSign, bSign;
    uint32_t av, bv;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        if (float32_is_signaling_nan(a, status)
         || float32_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat32Sign( a );
    bSign = extractFloat32Sign( b );
    av = float32_val(a);
    bv = float32_val(b);
    if ( aSign != bSign ) return aSign || ( (uint32_t) ( ( av | bv )<<1 ) == 0 );
    return ( av == bv ) || ( aSign ^ ( av < bv ) );

}